

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_redrawallfortemplatecanvas(_glist *x,int action)

{
  int iVar1;
  t_symbol *ptVar2;
  t_object *ptVar3;
  t_atom *ptVar4;
  t_template *template;
  t_atom *argv;
  t_object *ob;
  t_symbol *s1;
  t_template *tmpl;
  t_gobj *g;
  int action_local;
  _glist *x_local;
  
  ptVar2 = gensym("struct");
  for (tmpl = (t_template *)x->gl_list; tmpl != (t_template *)0x0; tmpl = (t_template *)tmpl->t_list
      ) {
    ptVar3 = pd_checkobject(&tmpl->t_pdobj);
    if ((((ptVar3 != (t_object *)0x0) && ((ptVar3->field_0x2e & 3) == 1)) &&
        (iVar1 = binbuf_getnatom(ptVar3->te_binbuf), 1 < iVar1)) &&
       (((ptVar4 = binbuf_getvec(ptVar3->te_binbuf), ptVar4->a_type == A_SYMBOL &&
         (ptVar4[1].a_type == A_SYMBOL)) && ((ptVar4->a_w).w_symbol == ptVar2)))) {
      template = template_findbyname(ptVar4[1].a_w.w_symbol);
      canvas_redrawallfortemplate(template,action);
    }
  }
  canvas_redrawallfortemplate((t_template *)0x0,action);
  return;
}

Assistant:

void canvas_redrawallfortemplatecanvas(t_canvas *x, int action)
{
    t_gobj *g;
    t_template *tmpl;
    t_symbol *s1 = gensym("struct");
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_object *ob = pd_checkobject(&g->g_pd);
        t_atom *argv;
        if (!ob || ob->te_type != T_OBJECT ||
            binbuf_getnatom(ob->te_binbuf) < 2)
            continue;
        argv = binbuf_getvec(ob->te_binbuf);
        if (argv[0].a_type != A_SYMBOL || argv[1].a_type != A_SYMBOL
            || argv[0].a_w.w_symbol != s1)
                continue;
        tmpl = template_findbyname(argv[1].a_w.w_symbol);
        canvas_redrawallfortemplate(tmpl, action);
    }
    canvas_redrawallfortemplate(0, action);
}